

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

bool anon_unknown.dwarf_775ed::arg_value_error(string *name,string *s,char *type)

{
  undefined1 uVar1;
  undefined1 extraout_AL;
  Logger *pLVar2;
  ostream *poVar3;
  size_t sVar4;
  string local_48;
  
  pLVar2 = GEO::Logger::instance();
  pLVar2->quiet_ = false;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"CmdLine","");
  poVar3 = GEO::Logger::err(&local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Argument ",9);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," received a bad value: \'",0x18);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(s->_M_dataplus)._M_p,s->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\' is not a ",0xb);
  if (type == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)poVar3->_vptr_basic_ostream[-3]);
  }
  else {
    sVar4 = strlen(type);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,type,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," value",6);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  uVar1 = std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
    uVar1 = extraout_AL;
  }
  return (bool)uVar1;
}

Assistant:

bool arg_value_error(
        const std::string& name,
        const std::string& s, const char* type
    ) {
        Logger::instance()->set_quiet(false);
        Logger::err("CmdLine")
            << "Argument " << name << " received a bad value: '"
            << s << "' is not a " << type << " value"
            << std::endl;
        return false;
    }